

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<char_const(&)[20],int,char_const(&)[6],kj::String&>
          (String *__return_storage_ptr__,kj *this,char (*params) [20],int *params_1,
          char (*params_2) [6],String *params_3)

{
  char *pcVar1;
  undefined1 local_70 [24];
  size_t local_58;
  ArrayPtr<const_char> local_50;
  CappedArray<char,_14UL> local_40;
  
  local_58 = strlen((char *)this);
  local_70._16_8_ = this;
  _::Stringifier::operator*(&local_40,(Stringifier *)&_::STR,*(int *)*params);
  local_70._8_8_ = strlen((char *)params_1);
  pcVar1 = *(char **)(params_2[1] + 2);
  local_50.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_50.ptr = *(char **)params_2;
  }
  local_50.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_50.size_ = (size_t)(pcVar1 + -1);
  }
  local_70._0_8_ = params_1;
  _::
  concat<kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)(local_70 + 0x10),(ArrayPtr<const_char> *)&local_40,
             (CappedArray<char,_14UL> *)local_70,&local_50,(ArrayPtr<const_char> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}